

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_static_class(writer *w,TypeDef *type)

{
  size_t *args;
  TypeDef *in_RCX;
  anon_class_16_2_3f6d9898 local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char *local_60;
  char *format;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  factories;
  string_view type_name;
  TypeDef *type_local;
  writer *w_local;
  
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeName(type);
  get_factories_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              *)&format,(cppwinrt *)w,(writer *)type,in_RCX);
  local_60 = "    struct %\n    {\n        %() = delete;\n%    };\n";
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"    struct %\n    {\n        %() = delete;\n%    };\n");
  local_80 = bind_each<&cppwinrt::write_static_declaration,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>,_winmd::reader::TypeDef>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                         *)&format,type);
  args = &factories._M_t._M_impl.super__Rb_tree_header._M_node_count;
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_70,
             (basic_string_view<char,_std::char_traits<char>_> *)args,
             (basic_string_view<char,_std::char_traits<char>_> *)args,&local_80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
          *)&format);
  return;
}

Assistant:

static void write_static_class(writer& w, TypeDef const& type)
    {
        auto type_name = type.TypeName();
        auto factories = get_factories(w, type);

        auto format = R"(    struct %
    {
        %() = delete;
%    };
)";

        w.write(format,
            type_name,
            type_name,
            bind_each<write_static_declaration>(factories, type));
    }